

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int mg_check_ip_acl(char *acl,uint32_t remote_ip)

{
  char cVar1;
  int iVar2;
  char *list;
  uint unaff_EBP;
  char *pcVar3;
  int iVar4;
  uint unaff_R15D;
  bool bVar5;
  int *piVar6;
  uint local_5c;
  int d;
  int c;
  int b;
  int a;
  int n;
  uint32_t local_44;
  mg_str vec;
  
  if (acl == (char *)0x0) {
    iVar4 = 0x2b;
  }
  else {
    iVar4 = (uint)(*acl != '\0') * 2 + 0x2b;
  }
  local_44 = remote_ip;
  list = mg_next_comma_list_entry(acl,&vec,(mg_str *)0x0);
  do {
    if (list == (char *)0x0) {
      return (uint)(iVar4 == 0x2b);
    }
    cVar1 = *vec.p;
    if ((cVar1 != '-') && (cVar1 != '+')) {
      return -1;
    }
    pcVar3 = vec.p + 1;
    local_5c = 0x20;
    piVar6 = &n;
    iVar2 = __isoc99_sscanf(pcVar3,"%d.%d.%d.%d/%d%n",&a,&b,&c,&d,&local_5c,piVar6);
    if (iVar2 == 5) {
LAB_0010b398:
      bVar5 = true;
      if (((((uint)a < 0x100) && ((uint)b < 0x100)) && ((uint)c < 0x100)) &&
         (local_5c < 0x21 && (uint)d < 0x100)) {
        unaff_EBP = -1 << (-(char)local_5c & 0x1fU);
        unaff_R15D = c << 8 | d | b << 0x10 | a << 0x18;
        if (local_5c == 0) {
          unaff_EBP = 0;
        }
        bVar5 = n == 0;
      }
    }
    else {
      iVar2 = __isoc99_sscanf(pcVar3,"%d.%d.%d.%d%n",&a,&b,&c,&d,&n,piVar6);
      bVar5 = true;
      if (iVar2 == 4) goto LAB_0010b398;
    }
    if (bVar5) {
      return -1;
    }
    if (unaff_R15D == (unaff_EBP & local_44)) {
      iVar4 = (int)cVar1;
    }
    list = mg_next_comma_list_entry(list,&vec,(mg_str *)0x0);
  } while( true );
}

Assistant:

int mg_check_ip_acl(const char *acl, uint32_t remote_ip) {
    int allowed, flag;
    uint32_t net, mask;
    struct mg_str vec;

    /* If any ACL is set, deny by default */
    allowed = (acl == NULL || *acl == '\0') ? '+' : '-';

    while ((acl = mg_next_comma_list_entry(acl, &vec, NULL)) != NULL) {
        flag = vec.p[0];
        if ((flag != '+' && flag != '-') ||
            parse_net(&vec.p[1], &net, &mask) == 0) {
            return -1;
        }

        if (net == (remote_ip & mask)) {
            allowed = flag;
        }
    }

    return allowed == '+';
}